

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

boolean detonate_obj(obj *otmp,obj *ostack,obj *olaunch,int x,int y,boolean thrown)

{
  char cVar1;
  byte bVar2;
  boolean bVar3;
  uint uVar4;
  char *pcVar5;
  schar sVar6;
  int iVar7;
  int tmp;
  int dam;
  bool bVar8;
  
  cVar1 = otmp->oartifact;
  bVar3 = obj_resists(otmp,0,100);
  if (bVar3 != '\0' && cVar1 == '\0') {
    return '\0';
  }
  bVar3 = oprop_attack(0x20000,otmp,olaunch,thrown);
  if (bVar3 == '\0') {
    if ((otmp->oprops & 0x20000) != 0) {
      bVar2 = otmp->oclass;
      if ((bVar2 == 2) || (bVar2 == 0xd)) {
        sVar6 = objects[otmp->otyp].oc_subtyp;
        if ((byte)(sVar6 + 0x18U) < 3) goto LAB_0014a58e;
        if ((bVar2 | 4) == 6) goto LAB_0014a6a9;
      }
      else if (bVar2 == 6) {
        sVar6 = objects[otmp->otyp].oc_subtyp;
LAB_0014a6a9:
        if ((byte)(sVar6 + 0x1bU) < 3) goto LAB_0014a58e;
      }
    }
    bVar8 = false;
  }
  else {
LAB_0014a58e:
    pcVar5 = xname(otmp);
    pline("The %s explodes!",pcVar5);
    oprop_id(0x20000,otmp,ostack,olaunch);
    if (cVar1 == '\0') {
      thrownobj = (obj *)0x0;
      obfree(otmp,(obj *)0x0);
    }
    dam = 4;
    iVar7 = -4;
    do {
      uVar4 = mt_random();
      dam = dam + (uVar4 & 3);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
    bVar8 = cVar1 == '\0';
    explode(x,y,0xb,dam,'\x02',5);
    scatter(x,y,dam,0x1f,(obj *)0x0);
  }
  return bVar8;
}

Assistant:

boolean detonate_obj(struct obj *otmp, struct obj *ostack, struct obj *olaunch,
		     int x, int y, boolean thrown)
{
	boolean is_artifact;
	int dmg;

	/* Don't destroy vital objects, but allow artifacts,
	 * e.g. the Heart of Ahriman fired from a sling of detonation . */
	is_artifact = !!otmp->oartifact;
	if (obj_resists(otmp, 0, 100) && !is_artifact)
	    return FALSE;

	if (!oprop_attack(ITEM_DETONATIONS, otmp, olaunch, thrown) &&
	    /* ammo and missiles may detonate even if dropped */
	    !((otmp->oprops & ITEM_DETONATIONS) &&
	      (is_ammo(otmp) || is_missile(otmp))))
	    return FALSE;

	pline("The %s explodes!", xname(otmp));
	oprop_id(ITEM_DETONATIONS, otmp, ostack, olaunch);

	if (!is_artifact) {
	    thrownobj = NULL;
	    obfree(otmp, NULL);
	    otmp = NULL;
	}

	/* otmp->ox and otmp->oy may not be set correctly, or even at all! */
	dmg = dice(4, 4);
	explode(x, y, ZT_SPELL(ZT_FIRE), dmg, WEAPON_CLASS, EXPL_FIERY);
	scatter(x, y, dmg, VIS_EFFECTS|MAY_HIT|MAY_DESTROY|MAY_FRACTURE, NULL);

	return !is_artifact;
}